

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O3

IterateResult __thiscall
glcts::GeometryShaderGetShaderivTest::iterate(GeometryShaderGetShaderivTest *this)

{
  ostringstream *this_00;
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  char *description;
  TestContext *this_02;
  bool bVar5;
  GLint shader_type;
  GLenum local_1a4;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  long lVar4;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported != false) {
    GVar2 = (**(code **)(lVar4 + 0x3f0))(0x8dd9);
    this->m_gs_id = GVar2;
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x1cb);
    local_1a4 = 0;
    (**(code **)(lVar4 + 0xa70))(this->m_gs_id,0x8b4f,&local_1a4);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x1d1);
    bVar5 = local_1a4 != (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER;
    if (bVar5) {
      local_1a0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Invalid shader type [",0x15);
      std::ostream::operator<<(this_00,local_1a4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"] reported for a Geometry Shader",0x20);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_128);
      this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Fail";
    }
    else {
      this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
    }
    tcu::TestContext::setTestResult(this_02,(uint)bVar5,description);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Geometry shader functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
             ,0x1c5);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderGetShaderivTest::iterate()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Create a GS */
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Check the type reported for the SO */
	glw::GLint shader_type = GL_NONE;

	gl.getShaderiv(m_gs_id, GL_SHADER_TYPE, &shader_type);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	if ((glw::GLenum)shader_type != m_glExtTokens.GEOMETRY_SHADER)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid shader type [" << shader_type
						   << "] reported for a Geometry Shader" << tcu::TestLog::EndMessage;

		result = false;
	}

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}